

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O2

bool __thiscall
DisasmReplayer::enqueue_create_descriptor_set_layout
          (DisasmReplayer *this,Hash hash,VkDescriptorSetLayoutCreateInfo *create_info,
          VkDescriptorSetLayout *layout)

{
  VkResult VVar1;
  VkDescriptorSetLayoutCreateInfo *create_info_local;
  
  create_info_local = create_info;
  if (this->device == (VulkanDevice *)0x0) {
    *layout = (VkDescriptorSetLayout)hash;
  }
  else {
    fprintf(_stderr,"Fossilize INFO: Creating descriptor set layout 0%lX\n");
    fflush(_stderr);
    VVar1 = (*vkCreateDescriptorSetLayout)
                      (this->device->device,create_info,(VkAllocationCallbacks *)0x0,layout);
    if (VVar1 != VK_SUCCESS) {
      fwrite("Fossilize ERROR:  ... Failed!\n",0x1e,1,_stderr);
      fflush(_stderr);
      return false;
    }
    fwrite("Fossilize INFO:  ... Succeeded!\n",0x20,1,_stderr);
    fflush(_stderr);
  }
  std::vector<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>::push_back
            (&this->layouts,layout);
  std::
  vector<const_VkDescriptorSetLayoutCreateInfo_*,_std::allocator<const_VkDescriptorSetLayoutCreateInfo_*>_>
  ::push_back(&this->set_layout_infos,&create_info_local);
  return true;
}

Assistant:

bool enqueue_create_descriptor_set_layout(Hash hash, const VkDescriptorSetLayoutCreateInfo *create_info, VkDescriptorSetLayout *layout) override
	{
		if (device)
		{
			LOGI("Creating descriptor set layout 0%" PRIX64 "\n", hash);
			if (vkCreateDescriptorSetLayout(device->get_device(), create_info, nullptr, layout) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*layout = fake_handle<VkDescriptorSetLayout>(hash);

		layouts.push_back(*layout);
		set_layout_infos.push_back(create_info);
		return true;
	}